

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *
wasm::WATParser::results<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  string_view expected;
  undefined1 local_c8 [8];
  Result<wasm::Type> type;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 local_80 [8];
  Result<wasm::Type> _val;
  _Uninitialized<wasm::Type,_true> *p_Stack_50;
  
  _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
  _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_7_ = 0;
  p_Stack_50 = (_Uninitialized<wasm::Type,_true> *)0x0;
  bVar3 = false;
  do {
    expected._M_str = "result";
    expected._M_len = 6;
    bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
    if (!bVar2) {
      if (bVar3) {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> =
             _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
        *(_Uninitialized<wasm::Type,_true> **)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 8) =
             p_Stack_50;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x10
         ) = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
         ) = '\0';
      }
      else {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
         ) = '\x01';
LAB_00bc8534:
        if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ != 0) {
          operator_delete((void *)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                          -_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_);
        }
      }
      return __return_storage_ptr__;
    }
    while( true ) {
      bVar3 = Lexer::takeRParen(&ctx->in);
      if (bVar3) break;
      valtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)local_c8,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_80,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_c8);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),local_80,
                   (long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                         _M_storage.id + (long)local_80);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> = puVar1;
        if ((undefined8 *)
            type.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == &local_90) {
          *puVar1 = local_90;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
           0x18) = uStack_88;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).
            super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> =
               type.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
           0x10) = local_90;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 8) =
             local_98;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
         ) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c8);
        goto LAB_00bc8534;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
      local_80 = local_c8;
      if (p_Stack_50 == (_Uninitialized<wasm::Type,_true> *)0x0) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(iterator)0x0,
                   (Type *)local_80);
      }
      else {
        p_Stack_50->_M_storage = (Type)local_c8;
        p_Stack_50 = p_Stack_50 + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c8);
    }
    bVar3 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}